

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool mz_zip_reader_end(mz_zip_archive *pZip)

{
  void *__s;
  long in_RDI;
  mz_zip_internal_state *pState;
  undefined4 local_34;
  
  if ((((in_RDI == 0) || (*(long *)(in_RDI + 0x58) == 0)) || (*(long *)(in_RDI + 0x20) == 0)) ||
     ((*(long *)(in_RDI + 0x28) == 0 || (*(int *)(in_RDI + 0x14) != 1)))) {
    local_34 = 0;
  }
  else {
    if (*(long *)(in_RDI + 0x58) != 0) {
      __s = *(void **)(in_RDI + 0x58);
      *(undefined8 *)(in_RDI + 0x58) = 0;
      (**(code **)(in_RDI + 0x28))(*(undefined8 *)(in_RDI + 0x38));
      memset(__s,0,0x20);
      (**(code **)(in_RDI + 0x28))(*(undefined8 *)(in_RDI + 0x38));
      memset((void *)((long)__s + 0x20),0,0x20);
      (**(code **)(in_RDI + 0x28))(*(undefined8 *)(in_RDI + 0x38));
      memset((void *)((long)__s + 0x40),0,0x20);
      if (*(long *)((long)__s + 0x60) != 0) {
        fclose(*(FILE **)((long)__s + 0x60));
        *(undefined8 *)((long)__s + 0x60) = 0;
      }
      (**(code **)(in_RDI + 0x28))(*(undefined8 *)(in_RDI + 0x38),__s);
    }
    *(undefined4 *)(in_RDI + 0x14) = 0;
    local_34 = 1;
  }
  return local_34;
}

Assistant:

mz_bool mz_zip_reader_end(mz_zip_archive *pZip)
{
  if ((!pZip) || (!pZip->m_pState) || (!pZip->m_pAlloc) || (!pZip->m_pFree) || (pZip->m_zip_mode != MZ_ZIP_MODE_READING))
    return MZ_FALSE;

  if (pZip->m_pState)
  {
    mz_zip_internal_state *pState = pZip->m_pState; pZip->m_pState = NULL;
    mz_zip_array_clear(pZip, &pState->m_central_dir);
    mz_zip_array_clear(pZip, &pState->m_central_dir_offsets);
    mz_zip_array_clear(pZip, &pState->m_sorted_central_dir_offsets);

#ifndef MINIZ_NO_STDIO
    if (pState->m_pFile)
    {
      MZ_FCLOSE(pState->m_pFile);
      pState->m_pFile = NULL;
    }
#endif // #ifndef MINIZ_NO_STDIO

    pZip->m_pFree(pZip->m_pAlloc_opaque, pState);
  }
  pZip->m_zip_mode = MZ_ZIP_MODE_INVALID;

  return MZ_TRUE;
}